

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O0

void __thiscall
lf::fe::FeHierarchicSegment<double>::FeHierarchicSegment
          (FeHierarchicSegment<double> *this,uint degree,QuadRuleCache *qr_cache)

{
  RefEl ref_el;
  QuadRule *pQVar1;
  QuadRuleCache *qr_cache_local;
  uint degree_local;
  FeHierarchicSegment<double> *this_local;
  
  (this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement =
       (_func_int **)0x0;
  ScalarReferenceFiniteElement<double>::ScalarReferenceFiniteElement
            (&this->super_ScalarReferenceFiniteElement<double>);
  (this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement =
       (_func_int **)&PTR__FeHierarchicSegment_00886008;
  this->degree_ = degree;
  ref_el = RefEl(this);
  pQVar1 = quad::QuadRuleCache::Get(qr_cache,ref_el,degree * 2 - 2);
  this->qr_dual_ = pQVar1;
  return;
}

Assistant:

FeHierarchicSegment(unsigned degree, const quad::QuadRuleCache &qr_cache)
      : ScalarReferenceFiniteElement<SCALAR>(),
        degree_(degree),
        qr_dual_(&qr_cache.Get(RefEl(), 2 * (degree - 1))) {}